

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::DualMaps::PrintFileMaps(DualMaps *this)

{
  DualMaps *in_stack_00000008;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_stack_00000018;
  DualMaps *in_stack_00000020;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
  *in_stack_ffffffffffffffd0;
  
  FileMaps(in_stack_00000008);
  PrintMaps(in_stack_00000020,in_stack_00000018);
  std::vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::~vector
            (in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void PrintFileMaps() { PrintMaps(FileMaps()); }